

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O2

LispPTR UFS_getfilename(LispPTR *args)

{
  uint uVar1;
  int iVar2;
  LispPTR *pLVar3;
  long lVar4;
  int *piVar5;
  size_t x;
  long lVar6;
  DLword *pDVar7;
  LispPTR LVar8;
  char lfname [4096];
  char file [4096];
  char local_2028 [4096];
  char local_1028 [4104];
  
  iVar2 = _setjmp((__jmp_buf_tag *)jmpbuf);
  if (iVar2 == 0) {
    Lisp_errno = (int *)NativeAligned4FromLAddr(args[3]);
    pLVar3 = NativeAligned4FromLAddr(*args);
    if (*(char *)((long)pLVar3 + 6) == 'D') {
      LVar8 = pLVar3[2] * 2;
LAB_0012df15:
      if ((long)(int)LVar8 - 0x1000U < 0xffffffffffffefff) {
        *Lisp_errno = 200;
        goto LAB_0012ded5;
      }
    }
    else {
      if (*(char *)((long)pLVar3 + 6) == 'C') {
        LVar8 = pLVar3[2];
        goto LAB_0012df15;
      }
      error("LispStringLength: Not a character array.\n");
    }
    pLVar3 = NativeAligned4FromLAddr(*args);
    LVar8 = 0x1000;
    if ((int)pLVar3[2] < 0x1000) {
      LVar8 = pLVar3[2];
    }
    lVar4 = (long)(int)LVar8;
    if (*(char *)((long)pLVar3 + 6) == 'D') {
      pDVar7 = Lisp_world + (ulong)(ushort)pLVar3[1] + (ulong)(*pLVar3 & 0xfffffff);
      for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
        local_2028[lVar6] = *(char *)((ulong)pDVar7 ^ 2);
        pDVar7 = pDVar7 + 1;
      }
      local_2028[lVar6] = '\0';
    }
    else if (*(char *)((long)pLVar3 + 6) == 'C') {
      uVar1 = *pLVar3;
      LVar8 = pLVar3[1];
      for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
        local_2028[lVar6] =
             *(char *)((long)Lisp_world +
                       lVar6 + (ulong)(ushort)LVar8 + (ulong)(uVar1 & 0xfffffff) * 2 ^ 3);
      }
      local_2028[lVar4] = '\0';
    }
    else {
      error("LispStringToCString: Not a character array.\n");
    }
    LVar8 = 0;
    iVar2 = unixpathname(local_2028,local_1028,0,0);
    if (iVar2 != 0) {
      if ((args[1] & 0xfffffffe) == 0xe0000) {
        alarm(TIMEOUT_TIME);
        piVar5 = __errno_location();
        do {
          *piVar5 = 0;
          iVar2 = access(local_1028,0);
          if (iVar2 != -1) {
            alarm(0);
            goto LAB_0012e07c;
          }
        } while (*piVar5 == 4);
        LVar8 = 0;
        alarm(0);
        *Lisp_errno = *piVar5;
      }
      else {
LAB_0012e07c:
        lisppathname(local_1028,local_2028,0,0);
        pLVar3 = NativeAligned4FromLAddr(args[2]);
        pDVar7 = Lisp_world;
        uVar1 = *pLVar3;
        x = strlen(local_2028);
        for (lVar4 = 0; x + 1 != lVar4; lVar4 = lVar4 + 1) {
          *(char *)((long)pDVar7 + lVar4 + (ulong)((uVar1 & 0xfffffff) * 2) ^ 3) = local_2028[lVar4]
          ;
        }
        LVar8 = GetSmallp(x);
      }
    }
  }
  else {
    *Lisp_errno = 100;
LAB_0012ded5:
    LVar8 = 0;
  }
  return LVar8;
}

Assistant:

LispPTR UFS_getfilename(LispPTR *args)
{
  char *base;
  size_t len;
  int rval;
  char lfname[MAXPATHLEN], file[MAXPATHLEN];

  ERRSETJMP(NIL);
  Lisp_errno = (int *)(NativeAligned4FromLAddr(args[3]));

  LispStringLength(args[0], len, rval);
  len += 1; /* Add 1 for terminating NULL char. */
  if (len > MAXPATHLEN) FileNameTooLong(NIL);

  LispStringToCString(args[0], lfname, MAXPATHLEN);
/*
 * Convert a Lisp file name to UNIX one.  This is a UNIX device method.
 * Thus we don't need to convert a version field.  Third argument for
 * unixpathname specifies it.
 */
#ifdef DOS
  if (unixpathname(lfname, file, 0, 0, 0, 0, 0) == 0) return (NIL);
#else
  if (unixpathname(lfname, file, 0, 0) == 0) return (NIL);
#endif /* DOS */

  switch (args[1]) {
    case RECOG_OLD:
    case RECOG_OLDEST:
      /*
       * "Old" and "Oldest" means the "existing" file.  All we have to do
       * is to make sure it is an existing file or not.
       */
      TIMEOUT(rval = access(file, F_OK));
      if (rval == -1) {
        *Lisp_errno = errno;
        return (NIL);
      }
      break;

    case RECOG_NEW:
    case RECOG_OLD_NEW:
    case RECOG_NON:
      /*
       * "New" file means the "not existing" file.  UNIX device always
       * recognizes a not existing file as if, the subsequent OPENFILE will
       * find the truth.
       * "Non" recognition is used to recognize a sysout file.
       */
      break;
  }
  /*
   * Now, we convert a file name back to Lisp format.  The version field have not
   * to be converted.  The fourth argument for lisppathname specifies it.
   */
  if (lisppathname(file, lfname, 0, 0) == 0) return (NIL);

  STRING_BASE(args[2], base);
  len = strlen(lfname);

#ifndef BYTESWAP
  strncpy(base, lfname, len + 1);
#else
  StrNCpyFromCToLisp(base, lfname, len + 1);
#endif /* BYTESWAP */

  return (GetSmallp(len));
}